

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

size_t mpack_expect_enum_optional(mpack_reader_t *reader,char **strings,size_t count)

{
  char *__s;
  mpack_error_t mVar1;
  uint32_t uVar2;
  int iVar3;
  ulong count_00;
  char *__s1;
  size_t sVar4;
  mpack_tag_t mVar5;
  size_t otherlen;
  char *other;
  size_t i;
  char *key;
  size_t keylen;
  size_t count_local;
  char **strings_local;
  mpack_reader_t *reader_local;
  
  mVar1 = mpack_reader_error(reader);
  if (mVar1 == mpack_ok) {
    mVar5 = mpack_peek_tag(reader);
    if (mVar5.type == mpack_type_str) {
      uVar2 = mpack_expect_str(reader);
      count_00 = (ulong)uVar2;
      __s1 = mpack_read_bytes_inplace(reader,count_00);
      mpack_done_str(reader);
      mVar1 = mpack_reader_error(reader);
      if (mVar1 == mpack_ok) {
        for (other = (char *)0x0; other < count; other = other + 1) {
          __s = strings[(long)other];
          sVar4 = strlen(__s);
          if ((count_00 == sVar4) && (iVar3 = memcmp(__s1,__s,count_00), iVar3 == 0)) {
            return (size_t)other;
          }
        }
      }
    }
    else {
      mpack_discard(reader);
    }
  }
  return count;
}

Assistant:

size_t mpack_expect_enum_optional(mpack_reader_t* reader, const char* strings[], size_t count) {
    if (mpack_reader_error(reader) != mpack_ok)
        return count;

    mpack_assert(count != 0, "count cannot be zero; no strings are valid!");
    mpack_assert(strings != NULL, "strings cannot be NULL");

    // the key is only recognized if it is a string
    if (mpack_peek_tag(reader).type != mpack_type_str) {
        mpack_discard(reader);
        return count;
    }

    // read the string in-place
    size_t keylen = mpack_expect_str(reader);
    const char* key = mpack_read_bytes_inplace(reader, keylen);
    mpack_done_str(reader);
    if (mpack_reader_error(reader) != mpack_ok)
        return count;

    // find what key it matches
    for (size_t i = 0; i < count; ++i) {
        const char* other = strings[i];
        size_t otherlen = mpack_strlen(other);
        if (keylen == otherlen && mpack_memcmp(key, other, keylen) == 0)
            return i;
    }

    // no matches
    return count;
}